

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  int iVar1;
  ulong body_size_00;
  size_t body_size;
  long local_40;
  size_t body_start;
  uint8_t *puStack_30;
  int ret;
  uint8_t *end;
  uint8_t *p;
  size_t size_local;
  void *bignum_local;
  ptls_buffer_t *buf_local;
  
  puStack_30 = (uint8_t *)((long)bignum + size);
  for (end = (uint8_t *)bignum; (0 < (long)puStack_30 - (long)end && (*end == '\0')); end = end + 1)
  {
  }
  body_start._3_1_ = 2;
  p = (uint8_t *)size;
  size_local = (size_t)bignum;
  bignum_local = buf;
  body_start._4_4_ = ptls_buffer__do_pushv(buf,(void *)((long)&body_start + 3),1);
  if (body_start._4_4_ == 0) {
    body_start._2_1_ = 0xff;
    body_start._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)bignum_local,(void *)((long)&body_start + 2),1);
    if (body_start._4_4_ == 0) {
      local_40 = *(long *)((long)bignum_local + 0x10);
      if (0x7f < *end) {
        body_size._7_1_ = 0;
        iVar1 = ptls_buffer__do_pushv
                          ((ptls_buffer_t *)bignum_local,(void *)((long)&body_size + 7),1);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      body_start._4_4_ = 0;
      if (end == puStack_30) {
        body_start._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)bignum_local,"",1);
      }
      else {
        body_start._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)bignum_local,end,(long)puStack_30 - (long)end);
      }
      if (body_start._4_4_ == 0) {
        body_start._4_4_ = 0;
        body_size_00 = ((ptls_buffer_t *)bignum_local)->off - local_40;
        if (body_size_00 < 0x80) {
          ((ptls_buffer_t *)bignum_local)->base[local_40 + -1] = (uint8_t)body_size_00;
        }
        else {
          iVar1 = ptls_buffer__adjust_asn1_blocksize((ptls_buffer_t *)bignum_local,body_size_00);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        body_start._4_4_ = 0;
      }
    }
  }
  return body_start._4_4_;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}